

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

float compare(vector<float,_std::allocator<float>_> *fv1,vector<float,_std::allocator<float>_> *fv2)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  pfVar3 = (fv1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  for (lVar4 = 0;
      (long)(fv1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
            ._M_finish - (long)pfVar3 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    fVar1 = pfVar3[lVar4];
    fVar2 = (fv2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
            ._M_start[lVar4];
    fVar7 = fVar7 + fVar1 * fVar2;
    fVar5 = fVar2 * fVar2 + fVar5;
    fVar6 = fVar1 * fVar1 + fVar6;
  }
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = acosf(fVar7 / (fVar6 * fVar5));
  return fVar5 / 3.1415927;
}

Assistant:

float compare(vector<float> &fv1, vector<float> &fv2){
    float dot = 0;
    float sum2 = 0;
    float sum3 = 0;
    for(int i = 0; i < fv1.size(); i++){
        dot += fv1[i]*fv2[i];
        sum2 += pow(fv1[i], 2);
        sum3 += pow(fv2[i], 2);
    }
    float norm = sqrt(sum2)*sqrt(sum3);
    float similary = dot / norm;
    float dist = acos(similary) / CV_PI;
    return dist;
}